

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void scm_clear(void)

{
  cell_map local_28;
  
  scm_stop();
  cell_map::cell_map(&local_28,width,height);
  cell_map::operator=(&grid,&local_28);
  cell_map::~cell_map(&local_28);
  paint_grid();
  return;
}

Assistant:

void scm_clear()
  {
  scm_stop();
  grid = cell_map(width, height);
  paint_grid();
  }